

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::TopKLayerParams::_InternalSerialize
          (TopKLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  void *data;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  size_t __n;
  
  if (this->axis_ != 0) {
    puVar2 = target;
    if (stream->end_ <= target) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar4 = this->axis_;
    *puVar2 = '\b';
    puVar2[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      target = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar4 | 0x80;
      puVar2[2] = (uint8_t)(uVar4 >> 7);
      target = puVar2 + 3;
      if (0x3fff < uVar4) {
        uVar5 = (ulong)puVar2[2];
        uVar4 = uVar4 >> 7;
        do {
          target[-1] = (byte)uVar5 | 0x80;
          uVar3 = uVar4 >> 7;
          *target = (uint8_t)uVar3;
          target = target + 1;
          uVar5 = uVar3 & 0xffffffff;
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar3;
        } while (bVar1);
      }
    }
  }
  puVar2 = target;
  if (this->k_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar4 = this->k_;
    *target = '\x10';
    target[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      puVar2 = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      target[2] = (uint8_t)(uVar4 >> 7);
      puVar2 = target + 3;
      if (0x3fff < uVar4) {
        uVar5 = (ulong)target[2];
        uVar4 = uVar4 >> 7;
        do {
          puVar2[-1] = (byte)uVar5 | 0x80;
          uVar3 = uVar4 >> 7;
          *puVar2 = (uint8_t)uVar3;
          puVar2 = puVar2 + 1;
          uVar5 = uVar3 & 0xffffffff;
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar3;
        } while (bVar1);
      }
    }
  }
  if (this->usebottomk_ == true) {
    if (stream->end_ <= puVar2) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
    }
    bVar1 = this->usebottomk_;
    *puVar2 = '\x18';
    puVar2[1] = bVar1;
    puVar2 = puVar2 + 2;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    data = *(void **)((uVar4 & 0xfffffffffffffffc) + 8);
    uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar4 & 1) == 0) {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar6 = (undefined8 *)((uVar4 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar6[1];
    if ((long)stream->end_ - (long)puVar2 < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar6[1],puVar2);
      return puVar2;
    }
    memcpy(puVar2,data,__n);
    puVar2 = puVar2 + __n;
  }
  return puVar2;
}

Assistant:

uint8_t* TopKLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TopKLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_axis(), target);
  }

  // uint64 K = 2;
  if (this->_internal_k() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_k(), target);
  }

  // bool useBottomK = 3;
  if (this->_internal_usebottomk() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_usebottomk(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TopKLayerParams)
  return target;
}